

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O2

pair<std::vector<int,_std::allocator<int>_>,_bool> * __thiscall
xla::GraphCycles::PathDagIDs
          (pair<std::vector<int,_std::allocator<int>_>,_bool> *__return_storage_ptr__,
          GraphCycles *this,int x,int y,int max_path_len)

{
  int iVar1;
  long lVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> path;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  if (PathDagIDs(int,int,int)::kPathSize == '\0') {
    iVar1 = __cxa_guard_acquire(&PathDagIDs(int,int,int)::kPathSize);
    if (iVar1 != 0) {
      PathDagIDs::kPathSize = max_path_len;
      __cxa_guard_release(&PathDagIDs(int,int,int)::kPathSize);
    }
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (int32_t *)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)&local_48,(long)PathDagIDs::kPathSize);
  iVar1 = FindPath(this,x,y,PathDagIDs::kPathSize,local_48._M_impl.super__Vector_impl_data._M_start)
  ;
  lVar3 = 0;
  for (lVar2 = 0; (lVar2 < iVar1 && (lVar2 < PathDagIDs::kPathSize)); lVar2 = lVar2 + 1) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_48,
               (value_type_conflict1 *)
               ((long)local_48._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + 4;
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&__return_storage_ptr__->first,(vector<int,_std::allocator<int>_> *)&local_48);
  __return_storage_ptr__->second = max_path_len < iVar1;
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<int32_t>, bool> GraphCycles::PathDagIDs(int x, int y, const int max_path_len) {
  static const int kPathSize = max_path_len;
  std::vector<int32_t> path;
  path.reserve(kPathSize);
  
  int np = FindPath(x, y, kPathSize, path.data());
  bool overflow = np > max_path_len;
  
  for (int i = 0; i < np; i++) {
      if (i >= kPathSize) {
          break;
      } 
      path.push_back(path[i]);
  }

  return std::pair<std::vector<int32_t>, bool>(path, overflow);
}